

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifneuron.cxx
# Opt level: O2

void __thiscall
IfNeuron::calibrate(IfNeuron *this,int isi,int spikes,int maxtime,NoiseSource *noises,
                   double increment,double decrement)

{
  StochasticEventGenerator *event;
  bool bVar1;
  ostream *poVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  double local_370;
  IntervalEstimator estimator;
  NullStream devnull;
  Matrix local_130;
  
  dVar7 = DifferentialEquation::getStartingValue(&this->ifneuronMembrane);
  this->ifneuronTheta = dVar7;
  event = &(this->super_SpikingNeuron).super_StochasticEventGenerator;
  IntervalEstimator::IntervalEstimator
            (&estimator,&EST_MEAN,event,
             (this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
             super_StochasticProcess.super_TimeDependent.xTime);
  NullStream::NullStream(&devnull);
  iVar4 = 0;
  uVar3 = 1;
  local_370 = 20.0;
  do {
    if (iVar4 == 1000) {
LAB_00132adb:
      (*(event->super_StochasticVariable).super_StochasticProcess.super_Parametric._vptr_Parametric
        [0xd])();
      std::ios_base::~ios_base((ios_base *)&devnull.super_ostream.field_0x8);
      IntervalEstimator::~IntervalEstimator(&estimator);
      return;
    }
    Time::run((this->super_SpikingNeuron).super_StochasticEventGenerator.super_StochasticVariable.
              super_StochasticProcess.super_TimeDependent.xTime,(long)spikes,event,(long)maxtime,
              &devnull.super_ostream,true);
    ScalarEstimator::getEstimate(&local_130,&estimator.super_ScalarEstimator,&EST_MEAN);
    dVar7 = Matrix::to_d(&local_130);
    dVar7 = dVar7 / ((this->super_SpikingNeuron).super_StochasticEventGenerator.
                     super_StochasticVariable.super_StochasticProcess.super_TimeDependent.xTime)->dt
    ;
    Matrix::~Matrix(&local_130);
    if (local_370 < 1e-05) {
      poVar2 = std::operator<<((ostream *)&std::cout,"\ncalibrated neuron after ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4);
      poVar2 = std::operator<<(poVar2," steps.\t\t\t\t\t");
      std::endl<char,std::char_traits<char>>(poVar2);
      goto LAB_00132adb;
    }
    uVar6 = -(ulong)(dVar7 == 0.0);
    dVar7 = (double)(uVar6 & 0x44b52d02c7e14af6 | ~uVar6 & (ulong)dVar7);
    bVar1 = (double)isi <= dVar7;
    bVar5 = uVar3 != (-(uint)bVar1 | 1);
    dVar8 = decrement;
    if (bVar5) {
      dVar8 = increment;
    }
    if (!bVar5) {
      uVar3 = (bVar1 - 1) + (uint)bVar1;
    }
    std::operator<<((ostream *)&std::cout,"\rthreshold: ");
    poVar2 = std::ostream::_M_insert<double>(this->ifneuronTheta);
    std::operator<<(poVar2,", spike rate: ");
    poVar2 = std::ostream::_M_insert<double>
                       (1.0 / (dVar7 * ((this->super_SpikingNeuron).super_StochasticEventGenerator.
                                        super_StochasticVariable.super_StochasticProcess.
                                        super_TimeDependent.xTime)->dt));
    std::operator<<(poVar2," Hz, target rate: ");
    poVar2 = std::ostream::_M_insert<double>
                       (1.0 / (((this->super_SpikingNeuron).super_StochasticEventGenerator.
                                super_StochasticVariable.super_StochasticProcess.super_TimeDependent
                               .xTime)->dt * (double)isi));
    std::operator<<(poVar2," Hz, next correction: ");
    local_370 = local_370 * dVar8;
    poVar2 = std::ostream::_M_insert<double>((double)(int)uVar3 * local_370);
    std::operator<<(poVar2,"\t\t\t");
    std::ostream::flush();
    this->ifneuronTheta = this->ifneuronTheta - (double)(int)uVar3 * local_370;
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void IfNeuron::calibrate(int isi, int spikes, int maxtime, NoiseSource *noises, double increment, double decrement)
{
	double stepsize = 20.0; // starting stepsize
	ifneuronTheta = ifneuronMembrane.getStartingValue();
	int direction = 1; // current direction 1-up, -1-down

	// new interval estimator, measuring time in units
	IntervalEstimator estimator(EST_MEAN, this, xTime);
	
	NullStream devnull;
	
	for( int k=0; k<1000; k++) {
		
		// test fpt
		xTime->run( spikes, this, maxtime, devnull );
		double mean = estimator.getEstimate(EST_MEAN).to_d() / xTime->dt;
		if( mean==0.0 ) mean = 1e23;
		
		// early stopping
		if( stepsize<0.00001 ) {
			cout << "\ncalibrated neuron after " << k << " steps.\t\t\t\t\t" << endl;
			break;
		}
	
		// adjust threshold
		if(mean < isi) {
			if (direction == 1) {
				// mean too large and direction up - decrease stepsize and turn
				stepsize *= decrement;
				direction *= -1;
			} else {
				// mean too large and direction down - increase stepsize and go on
				stepsize *= increment;
			}
		} else {
			if (direction == -1) {
				// mean too small and direction down - decrease stepsize and turn
				stepsize *= decrement;
				direction *= -1;
			} else {
				// mean too small and direction up - increase stepsize and go on
				stepsize *= increment;
			}
		}
		
		// note to the user
		cout << "\rthreshold: " << ifneuronTheta << ", spike rate: " << 1.0/(mean*xTime->dt) << " Hz, target rate: " << 1.0/(isi*xTime->dt) << " Hz, next correction: " << direction*stepsize << "\t\t\t" << flush;

		// apply correction
		ifneuronTheta -= direction * stepsize;
	}
	
	init();
}